

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_is_null(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  undefined4 local_24;
  int res;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  local_24 = 0;
  if (0 < nArg) {
    local_24 = jx9_value_is_null(*apArg);
  }
  jx9_result_bool(pCtx,local_24);
  return 0;
}

Assistant:

static int jx9Builtin_is_null(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	int res = 0; /* Assume false by default */
	if( nArg > 0 ){
		res = jx9_value_is_null(apArg[0]);
	}
	/* Query result */
	jx9_result_bool(pCtx, res);
	return JX9_OK;
}